

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  uivector nextcode;
  uivector blcount;
  uivector local_68;
  uivector local_48;
  
  local_48.data = (uint *)0x0;
  local_48.size = 0;
  local_48.allocsize = 0;
  local_68.data = (uint *)0x0;
  local_68.size = 0;
  local_68.allocsize = 0;
  puVar4 = (uint *)malloc((ulong)tree->numcodes << 2);
  sVar2 = local_48.size;
  uVar6 = 0x53;
  if (puVar4 != (uint *)0x0) {
    uVar6 = 0;
  }
  tree->tree1d = puVar4;
  uVar5 = (ulong)(tree->maxbitlen + 1);
  uVar3 = uivector_resize(&local_48,uVar5);
  if (((sVar2 <= uVar5 && uVar5 - sVar2 != 0) & (byte)uVar3) == 1) {
    memset(local_48.data + sVar2,0,(uVar5 - sVar2) * 4);
  }
  sVar2 = local_68.size;
  if (uVar3 != 0) {
    uVar5 = (ulong)(tree->maxbitlen + 1);
    uVar3 = uivector_resize(&local_68,uVar5);
    if (((sVar2 <= uVar5 && uVar5 - sVar2 != 0) & (byte)uVar3) == 1) {
      memset(local_68.data + sVar2,0,(uVar5 - sVar2) * 4);
    }
    if (uVar3 != 0) goto LAB_001155a5;
  }
  uVar6 = 0x53;
LAB_001155a5:
  if (uVar6 == 0) {
    if (tree->numcodes != 0) {
      uVar5 = 0;
      do {
        local_48.data[tree->lengths[uVar5]] = local_48.data[tree->lengths[uVar5]] + 1;
        uVar6 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar6;
      } while (uVar6 != tree->numcodes);
    }
    if (tree->maxbitlen != 0) {
      uVar6 = 1;
      do {
        local_68.data[uVar6] = (local_48.data[uVar6 - 1] + local_68.data[uVar6 - 1]) * 2;
        uVar6 = uVar6 + 1;
      } while (uVar6 <= tree->maxbitlen);
    }
    if (tree->numcodes != 0) {
      uVar5 = 0;
      do {
        uVar10 = (ulong)tree->lengths[uVar5];
        if (uVar10 != 0) {
          uVar6 = local_68.data[uVar10];
          local_68.data[uVar10] = uVar6 + 1;
          tree->tree1d[uVar5] = uVar6;
        }
        uVar6 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar6;
      } while (uVar6 != tree->numcodes);
    }
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
    local_68.data = (uint *)0x0;
    uVar6 = tree->numcodes;
    puVar4 = (uint *)malloc((ulong)(uVar6 * 2) << 2);
    tree->tree2d = puVar4;
    if (puVar4 == (uint *)0x0) {
      uVar6 = 0x53;
    }
    else {
      if ((uVar6 & 0x7fffffff) != 0) {
        uVar5 = 0;
        do {
          tree->tree2d[uVar5] = 0x7fff;
          uVar5 = uVar5 + 1;
        } while (uVar5 < tree->numcodes * 2);
      }
      if (tree->numcodes != 0) {
        uVar5 = 0;
        iVar8 = 0;
        iVar7 = 0;
        do {
          uVar6 = tree->lengths[uVar5];
          if (uVar6 != 0) {
            iVar9 = -1;
            uVar3 = 1;
            do {
              if ((iVar8 < 0) || (uVar1 = tree->numcodes, uVar1 < iVar8 + 2U)) {
                bVar12 = false;
              }
              else {
                puVar4 = tree->tree2d;
                uVar11 = (uint)((tree->tree1d[uVar5] >> (uVar6 + iVar9 & 0x1f) & 1) != 0) +
                         iVar8 * 2;
                if (puVar4[uVar11] == 0x7fff) {
                  if (uVar3 == uVar6) {
                    puVar4[uVar11] = (uint)uVar5;
                    bVar12 = true;
                    iVar8 = 0;
                  }
                  else {
                    iVar8 = iVar7 + 1;
                    puVar4[uVar11] = iVar7 + uVar1 + 1;
                    bVar12 = true;
                    iVar7 = iVar8;
                  }
                }
                else {
                  iVar8 = puVar4[uVar11] - uVar1;
                  bVar12 = true;
                }
              }
              if (!bVar12) {
                return 0x37;
              }
              uVar6 = tree->lengths[uVar5];
              iVar9 = iVar9 + -1;
              bVar12 = uVar3 != uVar6;
              uVar3 = uVar3 + 1;
            } while (bVar12);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < tree->numcodes);
      }
      if ((tree->numcodes & 0x7fffffff) == 0) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        uVar6 = 0;
        do {
          if (tree->tree2d[uVar5] == 0x7fff) {
            tree->tree2d[uVar5] = 0;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < tree->numcodes * 2);
      }
    }
  }
  else {
    local_48.size = 0;
    local_48.allocsize = 0;
    free(local_48.data);
    local_48.data = (uint *)0x0;
    local_68.size = 0;
    local_68.allocsize = 0;
    free(local_68.data);
  }
  return uVar6;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
	uivector blcount;
	uivector nextcode;
	unsigned error = 0;
	unsigned bits, n;

	uivector_init(&blcount);
	uivector_init(&nextcode);

	tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
	if (!tree->tree1d) error = 83; /*alloc fail*/

	if (!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
		|| !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
		error = 83; /*alloc fail*/

	if (!error)
	{
		/*step 1: count number of instances of each code length*/
		for (bits = 0; bits != tree->numcodes; ++bits) ++blcount.data[tree->lengths[bits]];
		/*step 2: generate the nextcode values*/
		for (bits = 1; bits <= tree->maxbitlen; ++bits)
		{
			nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
		}
		/*step 3: generate all the codes*/
		for (n = 0; n != tree->numcodes; ++n)
		{
			if (tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
		}
	}

	uivector_cleanup(&blcount);
	uivector_cleanup(&nextcode);

	if (!error) return HuffmanTree_make2DTree(tree);
	else return error;
}